

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_float_&,_const_Catch::Detail::Approx_&> * __thiscall
Catch::ExprLhs<float_const&>::operator==
          (BinaryExpr<const_float_&,_const_Catch::Detail::Approx_&> *__return_storage_ptr__,
          ExprLhs<float_const&> *this,Approx *rhs)

{
  float *lhs;
  bool comparisonResult;
  StringRef local_30;
  Approx *local_20;
  Approx *rhs_local;
  ExprLhs<const_float_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (Approx *)this;
  this_local = (ExprLhs<const_float_&> *)__return_storage_ptr__;
  comparisonResult = compareEqual<float,Catch::Detail::Approx>(*(float **)this,rhs);
  lhs = *(float **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_float_&,_const_Catch::Detail::Approx_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }